

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

void __thiscall
slang::ast::ForeachConstraint::serializeTo(ForeachConstraint *this,ASTSerializer *serializer)

{
  long lVar1;
  pointer this_00;
  string_view name;
  allocator<char> local_59;
  ForeachConstraint *local_58;
  string local_50;
  
  ASTSerializer::write(serializer,8,"arrayRef",(size_t)this->arrayRef);
  name._M_str = "loopDims";
  name._M_len = 8;
  ASTSerializer::startArray(serializer,name);
  this_00 = (this->loopDims).data_;
  local_58 = this;
  for (lVar1 = (this->loopDims).size_ * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    ASTSerializer::startObject(serializer);
    if ((this_00->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged == true) {
      ConstantRange::toString_abi_cxx11_(&local_50,(ConstantRange *)this_00);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"[]",&local_59);
    }
    ASTSerializer::write(serializer,5,"range",(size_t)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (this_00->loopVar != (IteratorSymbol *)0x0) {
      ASTSerializer::write(serializer,3,"var",(size_t)this_00->loopVar);
    }
    ASTSerializer::endObject(serializer);
    this_00 = this_00 + 1;
  }
  ASTSerializer::endArray(serializer);
  ASTSerializer::write(serializer,4,"body",(size_t)local_58->body);
  return;
}

Assistant:

void ForeachConstraint::serializeTo(ASTSerializer& serializer) const {
    serializer.write("arrayRef", arrayRef);

    serializer.startArray("loopDims");
    for (auto& r : loopDims) {
        serializer.startObject();
        serializer.write("range", r.range ? r.range->toString() : "[]");
        if (r.loopVar)
            serializer.write("var", *r.loopVar);
        serializer.endObject();
    }
    serializer.endArray();

    serializer.write("body", body);
}